

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_clone.c
# Opt level: O3

void clone_setup(void)

{
  t_symbol *ptVar1;
  _class *p_Var2;
  
  ptVar1 = gensym("clone");
  p_Var2 = class_new(ptVar1,clone_new,clone_free,0x88,8,A_GIMME,0);
  clone_class = p_Var2;
  ptVar1 = gensym("click");
  class_addmethod(p_Var2,clone_click,ptVar1,A_FLOAT,1,1,1,1,0);
  p_Var2 = clone_class;
  ptVar1 = gensym("loadbang");
  class_addmethod(p_Var2,clone_loadbang,ptVar1,A_FLOAT,0);
  p_Var2 = clone_class;
  ptVar1 = gensym("dsp");
  class_addmethod(p_Var2,clone_dsp,ptVar1,A_CANT,0);
  ptVar1 = gensym("clone-inlet");
  p_Var2 = class_new(ptVar1,(t_newmethod)0x0,(t_method)0x0,0x18,1,A_NULL);
  clone_in_class = p_Var2;
  ptVar1 = gensym("next");
  class_addmethod(p_Var2,clone_in_next,ptVar1,A_GIMME,0);
  p_Var2 = clone_in_class;
  ptVar1 = gensym("this");
  class_addmethod(p_Var2,clone_in_this,ptVar1,A_GIMME,0);
  p_Var2 = clone_in_class;
  ptVar1 = gensym("set");
  class_addmethod(p_Var2,clone_in_set,ptVar1,A_FLOAT,0);
  p_Var2 = clone_in_class;
  ptVar1 = gensym("all");
  class_addmethod(p_Var2,clone_in_all,ptVar1,A_GIMME,0);
  p_Var2 = clone_in_class;
  ptVar1 = gensym("vis");
  class_addmethod(p_Var2,clone_in_vis,ptVar1,A_FLOAT,1);
  p_Var2 = clone_in_class;
  ptVar1 = gensym("fwd");
  class_addmethod(p_Var2,clone_in_fwd,ptVar1,A_GIMME,0);
  class_addlist(clone_in_class,clone_in_list);
  ptVar1 = gensym("clone-outlet");
  clone_out_class = class_new(ptVar1,(t_newmethod)0x0,(t_method)0x0,0x18,1,A_NULL);
  class_addanything(clone_out_class,clone_out_anything);
  return;
}

Assistant:

void clone_setup(void)
{
    clone_class = class_new(gensym("clone"), (t_newmethod)clone_new,
        (t_method)clone_free, sizeof(t_clone), CLASS_NOINLET, A_GIMME, 0);
    class_addmethod(clone_class, (t_method)clone_click, gensym("click"),
        A_FLOAT, A_FLOAT, A_FLOAT, A_FLOAT, A_FLOAT, 0);
    class_addmethod(clone_class, (t_method)clone_loadbang, gensym("loadbang"),
        A_FLOAT, 0);
    class_addmethod(clone_class, (t_method)clone_dsp,
        gensym("dsp"), A_CANT, 0);

    clone_in_class = class_new(gensym("clone-inlet"), 0, 0,
        sizeof(t_in), CLASS_PD, 0);
    class_addmethod(clone_in_class, (t_method)clone_in_next, gensym("next"),
        A_GIMME, 0);
    class_addmethod(clone_in_class, (t_method)clone_in_this, gensym("this"),
        A_GIMME, 0);
    class_addmethod(clone_in_class, (t_method)clone_in_set, gensym("set"),
        A_FLOAT, 0);
    class_addmethod(clone_in_class, (t_method)clone_in_all, gensym("all"),
        A_GIMME, 0);
    class_addmethod(clone_in_class, (t_method)clone_in_vis, gensym("vis"),
        A_FLOAT, A_FLOAT, 0);
    class_addmethod(clone_in_class, (t_method)clone_in_fwd, gensym("fwd"),
        A_GIMME, 0);
    class_addlist(clone_in_class, (t_method)clone_in_list);

    clone_out_class = class_new(gensym("clone-outlet"), 0, 0,
        sizeof(t_in), CLASS_PD, 0);
    class_addanything(clone_out_class, (t_method)clone_out_anything);
}